

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ecf33::SymlinkCommand::configureOutputs
          (SymlinkCommand *this,ConfigureContext *ctx,
          vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *value
          )

{
  vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *this_00;
  bool bVar1;
  size_type sVar2;
  const_reference ppNVar3;
  Twine local_98;
  StringRef local_80;
  Twine local_70;
  Twine local_58;
  Twine local_40;
  value_type local_28;
  vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *local_20;
  vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *value_local;
  ConfigureContext *ctx_local;
  SymlinkCommand *this_local;
  
  local_20 = value;
  value_local = (vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                 *)ctx;
  ctx_local = (ConfigureContext *)this;
  sVar2 = std::vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>::
          size(value);
  if (sVar2 == 1) {
    ppNVar3 = std::
              vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>::
              operator[](local_20,0);
    local_28 = (value_type)*ppNVar3;
    std::
    vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>::
    push_back(&(this->super_Command).outputs,&local_28);
  }
  else {
    bVar1 = std::vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
            ::empty(local_20);
    this_00 = value_local;
    if (bVar1) {
      llvm::Twine::Twine(&local_40,"missing declared output");
      llbuild::buildsystem::ConfigureContext::error((ConfigureContext *)this_00,&local_40);
    }
    else {
      ppNVar3 = std::
                vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                ::operator[](local_20,1);
      local_80 = llbuild::buildsystem::Node::getName(*ppNVar3);
      llvm::operator+(&local_70,"unexpected explicit output: \'",&local_80);
      llvm::Twine::Twine(&local_98,"\'");
      llvm::operator+(&local_58,&local_70,&local_98);
      llbuild::buildsystem::ConfigureContext::error((ConfigureContext *)this_00,&local_58);
    }
  }
  return;
}

Assistant:

virtual void configureOutputs(const ConfigureContext& ctx,
                                const std::vector<Node*>& value) override {
    if (value.size() == 1) {
      outputs.push_back(static_cast<BuildNode*>(value[0]));
    } else if (value.empty()) {
      ctx.error("missing declared output");
    } else {
      ctx.error("unexpected explicit output: '" + value[1]->getName() + "'");
    }
  }